

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  undefined7 uVar12;
  _List_node_base *p_Var8;
  _Node *p_Var9;
  long *plVar10;
  undefined8 uVar11;
  ulong uVar13;
  long *plVar14;
  size_type *psVar15;
  long lVar16;
  bool set;
  bool bVar17;
  char *pcVar18;
  _List_node_base *p_Var19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  _Self __tmp;
  _List_node_base *p_Var23;
  bool debug;
  string tmp;
  string __str;
  string __str_1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  c_word;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s_name;
  ofstream fout;
  char local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  uint local_2e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  uint local_2bc;
  _List_node_base *local_2b8;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  ulong local_298;
  ulong local_290;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_2b8 = (_List_node_base *)argv;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                                    _             \tVersion : ",
             0x3d);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,str_ver_abi_cxx11_._M_dataplus._M_p,
                      str_ver_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"   ||  ||      ___ _ __ _   _ _ __ | |_ ___  _ __ \n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "   \\\\()//    / __| \'__| | | | \'_ \\| __/ _ \\| \'__|\tDeveloper : KonstantIMP\n",
             0x4a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "  //(__)\\\\  | (__| |  | |_| | |_) | || (_) | |   \tFeedback email : mihedovkos@gmail.com\n"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  ||    ||   \\___|_|   \\__, | .__/ \\__\\___/|_|   \n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "                       |___/|_|                  \tUse \"cryptor -h\" to view help message\n\n"
             ,0x59);
  iVar22 = 0;
  if (argc != 1) {
    local_329 = '\0';
    std::ofstream::ofstream(&local_230);
    p_Var19 = (_List_node_base *)&local_2b0;
    iVar22 = 0;
    local_2b0._M_impl._M_node._M_size = 0;
    local_268._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_268;
    local_268._M_impl._M_node._M_size = 0;
    bVar17 = 1 < argc;
    uVar12 = (undefined7)((ulong)local_268._M_impl._M_node.super__List_node_base._M_next >> 8);
    local_2b0._M_impl._M_node.super__List_node_base._M_next = p_Var19;
    local_2b0._M_impl._M_node.super__List_node_base._M_prev = p_Var19;
    local_268._M_impl._M_node.super__List_node_base._M_prev =
         local_268._M_impl._M_node.super__List_node_base._M_next;
    if (argc < 2) {
      local_2bc = (uint)CONCAT71(uVar12,1);
      uVar21 = 0;
      local_2e4 = 0;
    }
    else {
      local_290 = CONCAT44(local_290._4_4_,argc);
      iVar22 = 1;
      local_2bc = (uint)CONCAT71(uVar12,1);
      local_2e4 = 0;
      uVar21 = 0;
      do {
        p_Var8 = (&local_2b8->_M_next)[iVar22];
        iVar5 = strcmp((char *)p_Var8,"-h");
        if (iVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"CRYPTOR : version ",0x12);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,str_ver_abi_cxx11_._M_dataplus._M_p,
                              str_ver_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Cryptor is a simple programm, to encrypt & decrypt text messages\n\n",0x42);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"HELP MANUAL :\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t[USAGE] encryptor [OPTIONS] [WORDS]\n\n",0x26);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[OPTIONS]\n",10)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-d\tView debug output\n",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-v\tView version and exit\n",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-h\tView help message and exit\n",0x1f);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-a\tView (en/de)crypt algorithm and exit\n",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-t\tDon\'t ask about stings names\n",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-o [F]\tSet output file\n\n",0x19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t-m [M]\tSet output strings style\n",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t[STRING STYLE MODES]\n",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t\tC\tUse c-style strings\n",0x18);
          lVar16 = 0x1a;
          pcVar18 = "\t\tCPP\tUse cpp STL strings\n";
LAB_001032da:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,lVar16);
LAB_001032e6:
          iVar22 = 0;
          goto LAB_001032e9;
        }
        iVar5 = strcmp((char *)p_Var8,"-v");
        if (iVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Version is : ",0xd);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,str_ver_abi_cxx11_._M_dataplus._M_p,
                              str_ver_abi_cxx11_._M_string_length);
          local_328._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_328,1);
          goto LAB_001032e6;
        }
        iVar5 = strcmp((char *)p_Var8,"-d");
        if (iVar5 == 0) {
          local_329 = '\x01';
        }
        else {
          iVar5 = strcmp((char *)p_Var8,"-a");
          if (iVar5 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Encrytion & Decryption algorithm :\n\n",0x24);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] As an argument we get a text message in the form of a string :\n"
                       ,0x4d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tstring text_msg = \"Hello, World!\"\n\n",0x25);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] By definition string is a characters array\n",0x39);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 0] = \'H\'\t [ 7] = \'W\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 1] = \'e\'\t [ 8] = \'o\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 2] = \'l\'\t [ 9] = \'r\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 3] = \'l\'\t [10] = \'l\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 4] = \'o\'\t [11] = \'d\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 5] = \',\'\t [12] = \'!\'\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\t[ 6] = \' \'\n\n",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] Encryption & Decryption is performed one character at a time\n\n"
                       ,0x4c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] Two auxiliary unsigned character variables were created for Encryption & Decryption\n"
                       ,0x62);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tunsigned char a, b;\n\n",0x17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "[DESCRIPTION] The following actions are performed for each character\n",0x45
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\ta = b = text_msg[n]\n",0x16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\ta = a << 4\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tb = b >> 4\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\ta = b = ~(a | b) - 1\n",0x17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\ta = a << 4\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tb = b >> 4\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tresult = a | b\n\n",0x12);
            lVar16 = 0x5d;
            pcVar18 = 
            "[DESCRIPTION] The Encryption or Decryption results for each character form the source string\n"
            ;
            goto LAB_001032da;
          }
          iVar5 = strcmp((char *)p_Var8,"-t");
          if (iVar5 == 0) {
            local_2bc = 0;
          }
          else {
            iVar5 = strcmp((char *)p_Var8,"-m");
            if (iVar5 == 0) {
              pcVar18 = (char *)(&local_2b8->_M_prev)[iVar22];
              iVar5 = strcmp(pcVar18,"C");
              if (iVar5 == 0) {
                local_2e4 = 0;
                iVar22 = iVar22 + 1;
              }
              else {
                iVar5 = strcmp(pcVar18,"CPP");
                if (iVar5 != 0) {
                  iVar22 = 1;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"[ERROR] Incorrect string style mode\n",0x24);
                  goto LAB_001032e9;
                }
                local_2e4 = 1;
                iVar22 = iVar22 + 1;
              }
            }
            else {
              iVar5 = strcmp((char *)p_Var8,"-o");
              if (iVar5 == 0) {
                if ((uVar21 & 1) != 0) {
                  iVar22 = 2;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"You can use only one output file\n",0x21);
                  goto LAB_001032e9;
                }
                std::ofstream::open((char *)&local_230,(_Ios_Openmode)(&local_2b8->_M_prev)[iVar22])
                ;
                iVar5 = iVar22 + 1;
                cVar4 = std::__basic_file<char>::is_open();
                uVar21 = CONCAT71((int7)(int3)((uint)iVar22 >> 8),1);
                iVar22 = iVar5;
                if (cVar4 == '\0') {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Can\'t create or open output file\n",0x21);
                }
              }
              else {
                std::__cxx11::string::string
                          ((string *)&local_328,(char *)p_Var8,(allocator *)&local_308);
                paVar1 = &local_328.field_2;
                p_Var8 = (_List_node_base *)operator_new(0x30);
                p_Var8[1]._M_next = p_Var8 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p == paVar1) {
                  p_Var8[2]._M_next = (_List_node_base *)local_328.field_2._M_allocated_capacity;
                  p_Var8[2]._M_prev = (_List_node_base *)local_328.field_2._8_8_;
                }
                else {
                  p_Var8[1]._M_next = (_List_node_base *)local_328._M_dataplus._M_p;
                  p_Var8[2]._M_next = (_List_node_base *)local_328.field_2._M_allocated_capacity;
                }
                p_Var8[1]._M_prev = (_List_node_base *)local_328._M_string_length;
                local_328._M_string_length = 0;
                local_328.field_2._M_allocated_capacity =
                     local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_328._M_dataplus._M_p = (pointer)paVar1;
                std::__detail::_List_node_base::_M_hook(p_Var8);
                local_2b0._M_impl._M_node._M_size = local_2b0._M_impl._M_node._M_size + 1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != paVar1) {
                  operator_delete(local_328._M_dataplus._M_p,
                                  (ulong)(local_328.field_2._M_allocated_capacity + 1));
                }
              }
            }
          }
        }
        iVar22 = iVar22 + 1;
        bVar17 = iVar22 < (int)local_290;
      } while (iVar22 < (int)local_290);
      iVar22 = 0;
    }
LAB_001032e9:
    if (!bVar17) {
      local_298 = uVar21;
      if (local_329 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"[DEBUG] Debug output is ON\n\n",0x1c);
      }
      if (local_329 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"[DEBUG] String mode : ",0x16);
        pcVar18 = "C\n\n";
        if ((local_2e4 & 1) != 0) {
          pcVar18 = "CPP\n\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,pcVar18,(ulong)(local_2e4 & 1) * 2 + 3);
      }
      if (local_329 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"[DEBUG] Output to file is ",0x1a);
        pcVar18 = "OFF\n\n";
        if ((local_298 & 1) != 0) {
          pcVar18 = "ON\n\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,pcVar18,(ulong)((uint)local_298 & 1) ^ 5);
      }
      if (local_329 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"[DEBUG] Words analisys\n",0x17);
        if (local_2b0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_2b0
           ) {
          p_Var8 = local_2b0._M_impl._M_node.super__List_node_base._M_next;
          do {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_328,p_Var8[1]._M_next,
                       (long)&(p_Var8[1]._M_prev)->_M_next + (long)p_Var8[1]._M_next);
            local_308._0_1_ = (allocator)0x9;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::clog,(char *)&local_308,1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_328._M_dataplus._M_p,local_328._M_string_length);
            local_308 = (long *)CONCAT71(local_308._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_308,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,
                              (ulong)(local_328.field_2._M_allocated_capacity + 1));
            }
            p_Var8 = p_Var8->_M_next;
          } while (p_Var8 != (_List_node_base *)&local_2b0);
        }
      }
      uVar20 = local_2bc;
      if ((local_2bc & 1) != 0) {
        bVar17 = false;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nDo you want to set names for strings[y/n] : ",0x2d);
          uVar6 = _getch();
          if ((char)uVar6 == ' ') {
LAB_001034d8:
            bVar17 = true;
          }
          else {
            if ((uVar6 & 0xff) == 0x6e) {
              uVar20 = 0;
              goto LAB_001034d8;
            }
            if ((uVar6 & 0xff) == 0x79) goto LAB_001034d8;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Incorrect Answer! Try again!\n\n",0x1e);
          }
        } while (!bVar17);
      }
      p_Var8 = local_2b0._M_impl._M_node.super__List_node_base._M_next;
      if ((uVar20 & 1) == 0) {
        if (local_2b0._M_impl._M_node._M_size != 0) {
          paVar1 = &local_328.field_2;
          uVar21 = 0;
          do {
            cVar4 = '\x01';
            if (9 < uVar21) {
              uVar13 = uVar21;
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                if (uVar13 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_0010364a;
                }
                if (uVar13 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_0010364a;
                }
                if (uVar13 < 10000) goto LAB_0010364a;
                bVar17 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar3 = cVar4 + '\x04';
              } while (bVar17);
              cVar4 = cVar4 + '\x01';
            }
LAB_0010364a:
            local_308 = &local_2f8;
            std::__cxx11::string::_M_construct((ulong)&local_308,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_308,(uint)local_300,uVar21);
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,0x10581b);
            p_Var8 = (_List_node_base *)(plVar10 + 2);
            if ((_List_node_base *)*plVar10 == p_Var8) {
              local_328.field_2._M_allocated_capacity = (size_type)p_Var8->_M_next;
              local_328.field_2._8_8_ = plVar10[3];
              local_328._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_328.field_2._M_allocated_capacity = (size_type)p_Var8->_M_next;
              local_328._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_328._M_string_length = plVar10[1];
            *plVar10 = (long)p_Var8;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            p_Var8 = (_List_node_base *)operator_new(0x30);
            p_Var8[1]._M_next = p_Var8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p == paVar1) {
              p_Var8[2]._M_next = (_List_node_base *)local_328.field_2._M_allocated_capacity;
              p_Var8[2]._M_prev = (_List_node_base *)local_328.field_2._8_8_;
            }
            else {
              p_Var8[1]._M_next = (_List_node_base *)local_328._M_dataplus._M_p;
              p_Var8[2]._M_next = (_List_node_base *)local_328.field_2._M_allocated_capacity;
            }
            p_Var8[1]._M_prev = (_List_node_base *)local_328._M_string_length;
            local_328._M_string_length = 0;
            local_328.field_2._M_allocated_capacity =
                 local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_328._M_dataplus._M_p = (pointer)paVar1;
            std::__detail::_List_node_base::_M_hook(p_Var8);
            local_268._M_impl._M_node._M_size = local_268._M_impl._M_node._M_size + 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != paVar1) {
              operator_delete(local_328._M_dataplus._M_p,
                              (ulong)(local_328.field_2._M_allocated_capacity + 1));
            }
            if (local_308 != &local_2f8) {
              operator_delete(local_308,local_2f8 + 1);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < local_2b0._M_impl._M_node._M_size);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      else {
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
        if (local_2b0._M_impl._M_node._M_size != 0) {
          uVar21 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\nEnter name for ",0x10);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)p_Var8[1]._M_next,
                                (long)p_Var8[1]._M_prev);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," : ",3);
            std::operator>>((istream *)&std::cin,(string *)&local_328);
            p_Var9 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                     _M_create_node<std::__cxx11::string_const&>
                               ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                                &local_268,&local_328);
            std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
            local_268._M_impl._M_node._M_size = local_268._M_impl._M_node._M_size + 1;
            p_Var8 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next;
            uVar21 = uVar21 + 1;
          } while (uVar21 < local_2b0._M_impl._M_node._M_size);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,
                          (ulong)(local_328.field_2._M_allocated_capacity + 1));
        }
      }
      if (local_329 == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"[DEBUG] Starting crypt\n\n",0x18);
      }
      if (local_2b0._M_impl._M_node.super__List_node_base._M_next != p_Var19) {
        p_Var8 = local_2b0._M_impl._M_node.super__List_node_base._M_next;
        do {
          cryptor::crypt((cryptor *)&local_328,(char *)(p_Var8 + 1),&local_329);
          std::__cxx11::string::operator=((string *)(p_Var8 + 1),(string *)&local_328);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,
                            (ulong)(local_328.field_2._M_allocated_capacity + 1));
          }
          p_Var8 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next;
        } while (p_Var8 != p_Var19);
      }
      if (local_329 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::clog,"[DEBUG] Crypt result\n",0x15);
      }
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
      p_Var8 = (_List_node_base *)&local_268;
      uVar21 = local_298;
      if (local_2b0._M_impl._M_node._M_size != 0) {
        uVar13 = 0;
        do {
          p_Var8 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next;
          p_Var19 = p_Var19->_M_next;
          local_308 = (long *)CONCAT71(local_308._1_7_,9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::clog,(char *)&local_308,1);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"th - ",5);
          local_2b8 = p_Var8;
          local_290 = uVar13 + 1;
          if ((local_2e4 & 1) == 0) {
            std::operator+(&local_2e0,"char ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var8 + 1));
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
            plVar14 = plVar10 + 2;
            if ((long *)*plVar10 == plVar14) {
              local_2f8 = *plVar14;
              lStack_2f0 = plVar10[3];
              local_308 = &local_2f8;
            }
            else {
              local_2f8 = *plVar14;
              local_308 = (long *)*plVar10;
            }
            local_300 = plVar10[1];
            *plVar10 = (long)plVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
            if (local_308 != &local_2f8) {
              operator_delete(local_308,local_2f8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            p_Var8 = p_Var19[1]._M_prev;
            if (p_Var8 != (_List_node_base *)0x0) {
              p_Var23 = (_List_node_base *)0x0;
              do {
                if (p_Var23 == (_List_node_base *)((long)&p_Var8[-1]._M_prev + 7)) {
                  if (p_Var19[1]._M_prev <= p_Var23) {
                    std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                               ,p_Var23);
LAB_00103ec7:
                    uVar11 = std::__throw_out_of_range_fmt
                                       ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                        ,p_Var23);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p != &local_328.field_2) {
                      operator_delete(local_328._M_dataplus._M_p,
                                      (ulong)(local_328.field_2._M_allocated_capacity + 1));
                    }
                    std::__cxx11::
                    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::_M_clear(&local_268);
                    std::__cxx11::
                    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::_M_clear(&local_2b0);
                    std::ofstream::~ofstream(&local_230);
                    _Unwind_Resume(uVar11);
                  }
                  cVar4 = *(char *)((long)&p_Var23->_M_next + (long)p_Var19[1]._M_next);
                  uVar6 = (uint)cVar4;
                  uVar20 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar20 = uVar6;
                  }
                  uVar2 = 3 - (uVar20 < 100);
                  if (uVar20 < 10) {
                    uVar2 = 1;
                  }
                  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_2e0,(char)uVar2 - (cVar4 >> 7));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_2e0._M_dataplus._M_p + (uVar6 >> 0x1f),uVar2,uVar20);
                  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
                  local_308 = &local_2f8;
                  plVar14 = plVar10 + 2;
                  if ((long *)*plVar10 == plVar14) {
                    local_2f8 = *plVar14;
                    lStack_2f0 = plVar10[3];
                  }
                  else {
                    local_2f8 = *plVar14;
                    local_308 = (long *)*plVar10;
                  }
                  local_300 = plVar10[1];
                  *plVar10 = (long)plVar14;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_308);
                }
                else {
                  if (p_Var19[1]._M_prev <= p_Var23) goto LAB_00103ec7;
                  cVar4 = *(char *)((long)&p_Var23->_M_next + (long)p_Var19[1]._M_next);
                  uVar6 = (uint)cVar4;
                  uVar20 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar20 = uVar6;
                  }
                  uVar2 = 3 - (uVar20 < 100);
                  if (uVar20 < 10) {
                    uVar2 = 1;
                  }
                  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_2e0,(char)uVar2 - (cVar4 >> 7));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_2e0._M_dataplus._M_p + (uVar6 >> 0x1f),uVar2,uVar20);
                  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
                  local_308 = &local_2f8;
                  plVar14 = plVar10 + 2;
                  if ((long *)*plVar10 == plVar14) {
                    local_2f8 = *plVar14;
                    lStack_2f0 = plVar10[3];
                  }
                  else {
                    local_2f8 = *plVar14;
                    local_308 = (long *)*plVar10;
                  }
                  local_300 = plVar10[1];
                  *plVar10 = (long)plVar14;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_308);
                }
                if (local_308 != &local_2f8) {
                  operator_delete(local_308,local_2f8 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                  operator_delete(local_2e0._M_dataplus._M_p,
                                  local_2e0.field_2._M_allocated_capacity + 1);
                }
                p_Var23 = (_List_node_base *)((long)&p_Var23->_M_next + 1);
                p_Var8 = p_Var19[1]._M_prev;
              } while (p_Var23 < p_Var8);
            }
          }
          else {
            std::operator+(&local_250,"std::string ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var8 + 1));
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_250);
            plVar14 = plVar10 + 2;
            if ((long *)*plVar10 == plVar14) {
              local_278 = *plVar14;
              lStack_270 = plVar10[3];
              local_288 = &local_278;
            }
            else {
              local_278 = *plVar14;
              local_288 = (long *)*plVar10;
            }
            local_280 = plVar10[1];
            *plVar10 = (long)plVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_288,(ulong)p_Var19[1]._M_next);
            local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
            psVar15 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_2e0.field_2._M_allocated_capacity = *psVar15;
              local_2e0.field_2._8_8_ = plVar10[3];
            }
            else {
              local_2e0.field_2._M_allocated_capacity = *psVar15;
              local_2e0._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_2e0._M_string_length = plVar10[1];
            *plVar10 = (long)psVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
            plVar14 = plVar10 + 2;
            if ((long *)*plVar10 == plVar14) {
              local_2f8 = *plVar14;
              lStack_2f0 = plVar10[3];
              local_308 = &local_2f8;
            }
            else {
              local_2f8 = *plVar14;
              local_308 = (long *)*plVar10;
            }
            local_300 = plVar10[1];
            *plVar10 = (long)plVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_328,(string *)&local_308);
            if (local_308 != &local_2f8) {
              operator_delete(local_308,local_2f8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_288 != &local_278) {
              operator_delete(local_288,local_278 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::clog,local_328._M_dataplus._M_p,
                              local_328._M_string_length);
          uVar13 = local_290;
          uVar21 = local_298;
          p_Var8 = local_2b8;
          local_308 = (long *)CONCAT71(local_308._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_308,1);
          if ((uVar21 & 1) != 0) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_230,local_328._M_dataplus._M_p,
                                local_328._M_string_length);
            local_308 = (long *)CONCAT71(local_308._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_308,1);
          }
        } while (uVar13 < local_2b0._M_impl._M_node._M_size);
      }
      if ((uVar21 & 1) != 0) {
        std::ofstream::close();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,
                        (ulong)(local_328.field_2._M_allocated_capacity + 1));
      }
      iVar22 = 0;
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_268);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_2b0);
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _push_back;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  return iVar22;
}

Assistant:

int main(int argc, char * argv[]) {
    std::cout << "                                    _             \tVersion : " << str_ver << "\n";
    std::cout << "   ||  ||      ___ _ __ _   _ _ __ | |_ ___  _ __ \n";
    std::cout << "   \\\\()//    / __| '__| | | | '_ \\| __/ _ \\| '__|\tDeveloper : KonstantIMP\n";
    std::cout << "  //(__)\\\\  | (__| |  | |_| | |_) | || (_) | |   \tFeedback email : mihedovkos@gmail.com\n";
    std::cout << "  ||    ||   \\___|_|   \\__, | .__/ \\__\\___/|_|   \n";
    std::cout << "                       |___/|_|                  \tUse \"cryptor -h\" to view help message\n\n";

    if(argc == 1) {
        return 0;
    }

    bool mode = 0;
    bool debug = 0;
    bool f_out = 0;
    bool ask_name = true;

    std::ofstream fout;

    std::list<std::string> c_word;
    std::list<std::string> s_name;

    for(int i{1}; i < argc; i++) {
        if(strcmp(argv[i], "-h") == 0) {
            std::cout << "CRYPTOR : version " << str_ver << "\n\n";

            std::cout << "Cryptor is a simple programm, to encrypt & decrypt text messages\n\n";

            std::cout << "HELP MANUAL :\n";
            std::cout << "\t[USAGE] encryptor [OPTIONS] [WORDS]\n\n";

            std::cout << "[OPTIONS]\n";
            std::cout << "\t-d\tView debug output\n";
            std::cout << "\t-v\tView version and exit\n";
            std::cout << "\t-h\tView help message and exit\n";
            std::cout << "\t-a\tView (en/de)crypt algorithm and exit\n";
            std::cout << "\t-t\tDon't ask about stings names\n";

            std::cout << "\t-o [F]\tSet output file\n\n";

            std::cout << "\t-m [M]\tSet output strings style\n";

            std::cout << "\t[STRING STYLE MODES]\n";
            std::cout << "\t\tC\tUse c-style strings\n";
            std::cout << "\t\tCPP\tUse cpp STL strings\n";

            return 0;
        }
        if(strcmp(argv[i], "-v") == 0) {
            std::cout << "Version is : " << str_ver << '\n';
            return 0;
        }
        if(strcmp(argv[i], "-d") == 0) {
            debug = true; continue;
        }
        if(strcmp(argv[i], "-a") == 0) {
            std::cout << "Encrytion & Decryption algorithm :\n\n";

            std::cout << "[DESCRIPTION] As an argument we get a text message in the form of a string :\n";
            std::cout << "\t\tstring text_msg = \"Hello, World!\"\n\n";

            std::cout << "[DESCRIPTION] By definition string is a characters array\n";
            std::cout << "\t\t[ 0] = 'H'\t [ 7] = 'W'\n";
            std::cout << "\t\t[ 1] = 'e'\t [ 8] = 'o'\n";
            std::cout << "\t\t[ 2] = 'l'\t [ 9] = 'r'\n";
            std::cout << "\t\t[ 3] = 'l'\t [10] = 'l'\n";
            std::cout << "\t\t[ 4] = 'o'\t [11] = 'd'\n";
            std::cout << "\t\t[ 5] = ','\t [12] = '!'\n";
            std::cout << "\t\t[ 6] = ' '\n\n";

            std::cout << "[DESCRIPTION] Encryption & Decryption is performed one character at a time\n\n";

            std::cout << "[DESCRIPTION] Two auxiliary unsigned character variables were created for Encryption & Decryption\n";
            std::cout << "\t\tunsigned char a, b;\n\n";

            std::cout << "[DESCRIPTION] The following actions are performed for each character\n";
            std::cout << "\t\ta = b = text_msg[n]\n";
            std::cout << "\t\ta = a << 4\n";
            std::cout << "\t\tb = b >> 4\n";
            std::cout << "\t\ta = b = ~(a | b) - 1\n";
            std::cout << "\t\ta = a << 4\n";
            std::cout << "\t\tb = b >> 4\n";
            std::cout << "\t\tresult = a | b\n\n";

            std::cout << "[DESCRIPTION] The Encryption or Decryption results for each character form the source string\n";

            return 0;
        }
        if(strcmp(argv[i], "-t") == 0) {
            ask_name = false; continue;
        }
        if(strcmp(argv[i], "-m") == 0) {
            i++;

            if(strcmp(argv[i], "C") == 0) mode = 0;
            else if(strcmp(argv[i], "CPP") == 0) mode = 1;
            else {
                std::cout << "[ERROR] Incorrect string style mode\n";
                return 1;
            }

            continue;
        }
        if(strcmp(argv[i], "-o") == 0) {
            if(f_out) {
                std::cout << "You can use only one output file\n";
                return 2;
            }

            f_out = true; i++;

            fout.open(argv[i], std::ios_base::app);

            if(!fout.is_open()) {
                std::cout << "Can't create or open output file\n";
            }

            continue;
        }

        c_word.push_back(argv[i]);
    }

    if(debug) std::clog << "[DEBUG] Debug output is ON\n\n";

    if(debug) std::clog << "[DEBUG] String mode : " << (mode ? "CPP\n\n" : "C\n\n");

    if(debug) std::clog << "[DEBUG] Output to file is " << (f_out ? "ON\n\n" : "OFF\n\n");

    if(debug) {
        std::clog << "[DEBUG] Words analisys\n";

        for(auto iter : c_word) std::clog << '\t' << iter << '\n';
    }

    if(ask_name) {
        bool set = false; char ans = 0;

        do {
            std::cout << "\nDo you want to set names for strings[y/n] : ";
            ans = static_cast<char>(_getch());

            if(ans == 'n') {
                ask_name = false;
                set = true;
            }
            else if(ans == 'y' || ans == ' ') set = true;
            else std::cout << "Incorrect Answer! Try again!\n\n";
        } while(set == false);
    }

    if(ask_name) {
        auto iter = c_word.begin();

        std::string tmp = "";

        for(std::size_t i{0}; i < c_word.size(); i++) {
            std::cout << "\nEnter name for " << *iter << " : ";
            std::cin >> tmp;

            s_name.push_back(tmp);

            iter++;
        }
    }
    else {
        for(std::size_t i{0}; i < c_word.size(); i++) s_name.push_back("str" + std::to_string(i));

        std::cout << "\n";
    }

    if(debug) std::clog << "[DEBUG] Starting crypt\n\n";

    for(auto & iter : c_word) iter = cryptor::crypt(iter, debug);

    if(debug) std::clog << "[DEBUG] Crypt result\n";

    std::string tmp = ""; auto iter = c_word.begin();
    auto name_iter = s_name.begin();

    for(std::size_t i{0}; i < c_word.size(); i++) {
        std::clog << '\t' << i + 1 << "th - ";

        if(mode) {
            tmp = "std::string " + *name_iter + " = \"" + *iter + "\";";
        }
        else {
            tmp = "char " + *name_iter + "[] = {";

            for(std::size_t j{0}; j < (*iter).length(); j++) {
                if(j != ((*iter).length() - 1)) tmp += std::to_string(static_cast<int>((*iter).at(j))) + ", ";
                else tmp += std::to_string(static_cast<int>((*iter).at(j))) + ", 0 };";
            }
        }

        std::clog << tmp << '\n';

        if(f_out) fout << tmp << '\n';

        iter++; name_iter++;
    }

    if(f_out) fout.close();

	return 0;
}